

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O0

CURLcode Curl_output_ntlm(connectdata *conn,_Bool proxy)

{
  CURLcode CVar1;
  char *pcVar2;
  char *local_88;
  char *local_80;
  auth *local_78;
  auth *authp;
  curlntlm *state;
  ntlmdata *ntlm;
  char *hostname;
  char *service;
  char *passwdp;
  char *userp;
  char **allocuserpwd;
  size_t sStack_30;
  CURLcode result;
  size_t len;
  char *base64;
  connectdata *pcStack_18;
  _Bool proxy_local;
  connectdata *conn_local;
  
  len = 0;
  sStack_30 = 0;
  if (proxy) {
    userp = (char *)&conn->allocptr;
    passwdp = (conn->http_proxy).user;
    service = (conn->http_proxy).passwd;
    if ((conn->data->set).str[0x35] == (char *)0x0) {
      local_80 = "HTTP";
    }
    else {
      local_80 = (conn->data->set).str[0x35];
    }
    hostname = local_80;
    ntlm = (ntlmdata *)(conn->http_proxy).host.name;
    state = &(conn->proxyntlm).flags;
    authp = (auth *)&conn->proxy_ntlm_state;
    local_78 = &(conn->data->state).authproxy;
  }
  else {
    userp = (char *)&(conn->allocptr).userpwd;
    passwdp = conn->user;
    service = conn->passwd;
    if ((conn->data->set).str[0x36] == (char *)0x0) {
      local_88 = "HTTP";
    }
    else {
      local_88 = (conn->data->set).str[0x36];
    }
    hostname = local_88;
    ntlm = (ntlmdata *)(conn->host).name;
    state = &(conn->ntlm).flags;
    authp = (auth *)&conn->http_ntlm_state;
    local_78 = &(conn->data->state).authhost;
  }
  local_78->field_0x18 = local_78->field_0x18 & 0xfe;
  if (passwdp == (char *)0x0) {
    passwdp = "";
  }
  if (service == (char *)0x0) {
    service = "";
  }
  base64._7_1_ = proxy;
  pcStack_18 = conn;
  switch((int)authp->want) {
  case 1:
  default:
    CVar1 = Curl_auth_create_ntlm_type1_message
                      (conn->data,passwdp,service,hostname,(char *)ntlm,(ntlmdata *)state,
                       (char **)&len,&stack0xffffffffffffffd0);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if (len != 0) {
      (*Curl_cfree)(*(void **)userp);
      pcVar2 = "";
      if ((base64._7_1_ & 1) != 0) {
        pcVar2 = "Proxy-";
      }
      pcVar2 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar2,len);
      *(char **)userp = pcVar2;
      (*Curl_cfree)((void *)len);
      if (*(long *)userp == 0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    break;
  case 2:
    CVar1 = Curl_auth_create_ntlm_type3_message
                      (conn->data,passwdp,service,(ntlmdata *)state,(char **)&len,
                       &stack0xffffffffffffffd0);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if (len != 0) {
      (*Curl_cfree)(*(void **)userp);
      pcVar2 = "";
      if ((base64._7_1_ & 1) != 0) {
        pcVar2 = "Proxy-";
      }
      pcVar2 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar2,len);
      *(char **)userp = pcVar2;
      (*Curl_cfree)((void *)len);
      if (*(long *)userp == 0) {
        return CURLE_OUT_OF_MEMORY;
      }
      *(undefined4 *)&authp->want = 3;
      local_78->field_0x18 = local_78->field_0x18 & 0xfe | 1;
    }
    break;
  case 3:
    *(undefined4 *)&authp->want = 4;
  case 4:
    (*Curl_cfree)(*(void **)userp);
    userp[0] = '\0';
    userp[1] = '\0';
    userp[2] = '\0';
    userp[3] = '\0';
    userp[4] = '\0';
    userp[5] = '\0';
    userp[6] = '\0';
    userp[7] = '\0';
    local_78->field_0x18 = local_78->field_0x18 & 0xfe | 1;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_output_ntlm(struct connectdata *conn, bool proxy)
{
  char *base64 = NULL;
  size_t len = 0;
  CURLcode result;

  /* point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for a HTTP proxy */
  char **allocuserpwd;

  /* point to the username, password, service and host */
  const char *userp;
  const char *passwdp;
  const char *service = NULL;
  const char *hostname = NULL;

  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  curlntlm *state;
  struct auth *authp;

  DEBUGASSERT(conn);
  DEBUGASSERT(conn->data);

#if defined(NTLM_NEEDS_NSS_INIT)
  if(CURLE_OK != Curl_nss_force_init(conn->data))
    return CURLE_OUT_OF_MEMORY;
#endif

  if(proxy) {
    allocuserpwd = &conn->allocptr.proxyuserpwd;
    userp = conn->http_proxy.user;
    passwdp = conn->http_proxy.passwd;
    service = conn->data->set.str[STRING_PROXY_SERVICE_NAME] ?
              conn->data->set.str[STRING_PROXY_SERVICE_NAME] : "HTTP";
    hostname = conn->http_proxy.host.name;
    ntlm = &conn->proxyntlm;
    state = &conn->proxy_ntlm_state;
    authp = &conn->data->state.authproxy;
  }
  else {
    allocuserpwd = &conn->allocptr.userpwd;
    userp = conn->user;
    passwdp = conn->passwd;
    service = conn->data->set.str[STRING_SERVICE_NAME] ?
              conn->data->set.str[STRING_SERVICE_NAME] : "HTTP";
    hostname = conn->host.name;
    ntlm = &conn->ntlm;
    state = &conn->http_ntlm_state;
    authp = &conn->data->state.authhost;
  }
  authp->done = FALSE;

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#ifdef USE_WINDOWS_SSPI
  if(s_hSecDll == NULL) {
    /* not thread safe and leaks - use curl_global_init() to avoid */
    CURLcode err = Curl_sspi_global_init();
    if(s_hSecDll == NULL)
      return err;
  }
#ifdef SECPKG_ATTR_ENDPOINT_BINDINGS
  ntlm->sslContext = conn->sslContext;
#endif
#endif

  switch(*state) {
  case NTLMSTATE_TYPE1:
  default: /* for the weird cases we (re)start here */
    /* Create a type-1 message */
    result = Curl_auth_create_ntlm_type1_message(conn->data, userp, passwdp,
                                                 service, hostname,
                                                 ntlm, &base64,
                                                 &len);
    if(result)
      return result;

    if(base64) {
      free(*allocuserpwd);
      *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                              proxy ? "Proxy-" : "",
                              base64);
      free(base64);
      if(!*allocuserpwd)
        return CURLE_OUT_OF_MEMORY;

      DEBUG_OUT(fprintf(stderr, "**** Header %s\n ", *allocuserpwd));
    }
    break;

  case NTLMSTATE_TYPE2:
    /* We already received the type-2 message, create a type-3 message */
    result = Curl_auth_create_ntlm_type3_message(conn->data, userp, passwdp,
                                                 ntlm, &base64, &len);
    if(result)
      return result;

    if(base64) {
      free(*allocuserpwd);
      *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                              proxy ? "Proxy-" : "",
                              base64);
      free(base64);
      if(!*allocuserpwd)
        return CURLE_OUT_OF_MEMORY;

      DEBUG_OUT(fprintf(stderr, "**** %s\n ", *allocuserpwd));

      *state = NTLMSTATE_TYPE3; /* we send a type-3 */
      authp->done = TRUE;
    }
    break;

  case NTLMSTATE_TYPE3:
    /* connection is already authenticated,
     * don't send a header in future requests */
    *state = NTLMSTATE_LAST;
    /* FALLTHROUGH */
  case NTLMSTATE_LAST:
    Curl_safefree(*allocuserpwd);
    authp->done = TRUE;
    break;
  }

  return CURLE_OK;
}